

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalWriteFile
                    (CPalThread *pThread,HANDLE hFile,LPCVOID lpBuffer,DWORD nNumberOfBytesToWrite,
                    LPDWORD lpNumberOfBytesWritten,LPOVERLAPPED lpOverlapped)

{
  ssize_t sVar1;
  LONG local_6c;
  int res;
  LONG writeOffsetStartHigh;
  LONG writeOffsetStartLow;
  int ifd;
  IFileTransactionLock *pTransactionLock;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  LPOVERLAPPED pvStack_38;
  PAL_ERROR palError;
  LPOVERLAPPED lpOverlapped_local;
  LPDWORD lpNumberOfBytesWritten_local;
  LPCVOID pvStack_20;
  DWORD nNumberOfBytesToWrite_local;
  LPCVOID lpBuffer_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pTransactionLock = (IFileTransactionLock *)0x0;
  _writeOffsetStartLow = (undefined8 *)0x0;
  res = 0;
  local_6c = 0;
  pvStack_38 = lpOverlapped;
  lpOverlapped_local = lpNumberOfBytesWritten;
  lpNumberOfBytesWritten_local._4_4_ = nNumberOfBytesToWrite;
  pvStack_20 = lpBuffer;
  lpBuffer_local = hFile;
  hFile_local = pThread;
  if (lpNumberOfBytesWritten == (LPDWORD)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalWriteFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x806);
    fprintf(_stderr,"lpNumberOfBytesWritten is NULL\n");
    pFileObject._4_4_ = 0x57;
  }
  else {
    *lpNumberOfBytesWritten = 0;
    if (((undefined1 *)hFile == &DAT_ffffffffffffffff) || (hFile == pStdIn)) {
      pFileObject._4_4_ = 6;
    }
    else if (lpOverlapped == (LPOVERLAPPED)0x0) {
      pFileObject._4_4_ =
           (**(code **)(*g_pObjectManager + 0x28))
                     (g_pObjectManager,pThread,hFile,aotFile,0x40000000,&pLocalData);
      if ((pFileObject._4_4_ == 0) &&
         (pFileObject._4_4_ =
               (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                         (pLocalData,hFile_local,0,&pTransactionLock,&pLocalDataLock),
         pFileObject._4_4_ == 0)) {
        if (*(int *)((long)&pLocalDataLock[2]._vptr_IDataLock + 4) == 1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pFileObject._4_4_ = 5;
        }
        else {
          writeOffsetStartHigh = *(LONG *)&pLocalDataLock[1]._vptr_IDataLock;
          if (pLocalDataLock->_vptr_IDataLock != (_func_int **)0x0) {
            pFileObject._4_4_ =
                 InternalSetFilePointerForUnixFd(writeOffsetStartHigh,0,&local_6c,1,&res);
            if (pFileObject._4_4_ != 0) {
              fprintf(_stderr,"] %s %s:%d","InternalWriteFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                      ,0x84c);
              fprintf(_stderr,"Failed to get the current file position\n");
              pFileObject._4_4_ = 0x54f;
              goto LAB_003b076f;
            }
            pFileObject._4_4_ =
                 (**(code **)*pLocalDataLock->_vptr_IDataLock)
                           (pLocalDataLock->_vptr_IDataLock,hFile_local,1,res,local_6c,
                            lpNumberOfBytesWritten_local._4_4_,0,&writeOffsetStartLow);
            if (pFileObject._4_4_ != 0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              goto LAB_003b076f;
            }
          }
          (**pTransactionLock->_vptr_IFileTransactionLock)(pTransactionLock,hFile_local,0);
          pTransactionLock = (IFileTransactionLock *)0x0;
          pLocalDataLock = (IDataLock *)0x0;
          sVar1 = write(writeOffsetStartHigh,pvStack_20,(ulong)lpNumberOfBytesWritten_local._4_4_);
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          if ((int)sVar1 < 0) {
            pFileObject._4_4_ = FILEGetLastErrorFromErrno();
          }
          else {
            *(int *)lpOverlapped_local = (int)sVar1;
          }
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalWriteFile",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,0x813);
      fprintf(_stderr,"lpOverlapped is not NULL, as it should be.\n");
      pFileObject._4_4_ = 0x57;
    }
  }
LAB_003b076f:
  if (_writeOffsetStartLow != (undefined8 *)0x0) {
    (**(code **)*_writeOffsetStartLow)();
  }
  if (pTransactionLock != (IFileTransactionLock *)0x0) {
    (**pTransactionLock->_vptr_IFileTransactionLock)(pTransactionLock,hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalWriteFile(
    CPalThread *pThread,
    HANDLE hFile,
    LPCVOID lpBuffer,
    DWORD nNumberOfBytesToWrite,
    LPDWORD lpNumberOfBytesWritten,
    LPOVERLAPPED lpOverlapped
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    IFileTransactionLock *pTransactionLock = NULL;
    int ifd;

    LONG writeOffsetStartLow = 0, writeOffsetStartHigh = 0;
    int res;

    if (NULL != lpNumberOfBytesWritten)
    {
        //
        // This must be set to 0 before any other error checking takes
        // place, per MSDN
        //

        *lpNumberOfBytesWritten = 0;
    }
    else
    {
        ASSERT( "lpNumberOfBytesWritten is NULL\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    // Win32 WriteFile disallows writing to STD_INPUT_HANDLE
    if (hFile == INVALID_HANDLE_VALUE || hFile == pStdIn)
    {
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }
    else if ( lpOverlapped )
    {
        ASSERT( "lpOverlapped is not NULL, as it should be.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_WRITE,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }
    
    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto done;
    }

    ifd = pLocalData->unix_fd;

    //
    // Inform the lock controller for this file (if any) of our intention
    // to perform a write. (Note that pipes don't have lock controllers.)
    //
    
    if (NULL != pLocalData->pLockController)
    {
        /* Get the current file position to calculate the region to lock */
        palError = InternalSetFilePointerForUnixFd(
            ifd,
            0,
            &writeOffsetStartHigh,
            FILE_CURRENT,
            &writeOffsetStartLow
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Failed to get the current file position\n");
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }

        palError = pLocalData->pLockController->GetTransactionLock(
            pThread,
            IFileLockController::WriteLock,
            writeOffsetStartLow,
            writeOffsetStartHigh,
            nNumberOfBytesToWrite,
            0,
            &pTransactionLock
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to obtain write transaction lock");
            goto done;
        }
    }

    //
    // Release the data lock before performing the (possibly blocking)
    // write call
    //

    pLocalDataLock->ReleaseLock(pThread, FALSE);
    pLocalDataLock = NULL;
    pLocalData = NULL;

#if WRITE_0_BYTES_HANGS_TTY
    if( nNumberOfBytesToWrite == 0 && isatty(ifd) )
    {
        res = 0;
        *lpNumberOfBytesWritten = 0;
        goto done;
    }
#endif

    res = write( ifd, lpBuffer, nNumberOfBytesToWrite );  
    TRACE("write() returns %d\n", res);

    if ( res >= 0 )
    {
        *lpNumberOfBytesWritten = res;
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    
done:
    
    if (NULL != pTransactionLock)
    {
        pTransactionLock->ReleaseLock();
    }

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}